

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::LoopTerminatorCollector::visitContinueStatement
          (LoopTerminatorCollector *this,ContinueStatement *stmt)

{
  if (this->_firstLevel == true) {
    this->hasUnconditionalTerm = true;
    this->hasUnconditionalContinue = true;
    if (this->terminator == (Statement *)0x0) {
      this->terminator = (Statement *)stmt;
      return;
    }
  }
  else if (this->hasUnconditionalTerm == false) {
    this->hasCondContinue = true;
    return;
  }
  return;
}

Assistant:

void visitContinueStatement(ContinueStatement *stmt) {
    if (_firstLevel) {
      hasUnconditionalTerm = true;
      hasUnconditionalContinue = true;
      setTerminator(stmt);
    }
    else if (!hasUnconditionalTerm)
      hasCondContinue = true;
  }